

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_importedComponentUsingUnitsDefinedInImportedModel_Test::TestBody
          (ModelFlattening_importedComponentUsingUnitsDefinedInImportedModel_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  element_type *peVar5;
  element_type *peVar6;
  AssertHelper local_1f8 [8];
  Message local_1f0 [8];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  string a;
  PrinterPtr printer;
  AssertionResult local_198 [2];
  AssertHelper local_178 [8];
  Message local_170 [15];
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__1;
  string local_148 [32];
  string local_128 [32];
  AssertionResult local_108 [2];
  AssertHelper local_e8 [8];
  Message local_e0 [15];
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  ImporterPtr importer;
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [8];
  ModelPtr model;
  ParserPtr parser;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  ModelFlattening_importedComponentUsingUnitsDefinedInImportedModel_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main_model\">\n  <units name=\"fergie_time\">\n    <unit prefix=\"mega\" units=\"second\"/>\n  </units>\n  <component name=\"my_component\">\n    <variable name=\"time\" units=\"fergie_time\" interface=\"public_and_private\"/>\n  </component>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  p_Var1 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(p_Var1,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             p_Var1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"modelflattening/unitsdefinedinimportedmodel.xml",
             (allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  fileContents(local_88);
  libcellml::Parser::parseModel((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Importer::create((bool)((char)&gtest_ar_ + '\b'));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_d1 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar3) {
    testing::Message::Message(local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_108,local_d0,"model->hasUnresolvedImports()","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x1c5,pcVar4);
    testing::internal::AssertHelper::operator=(local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    std::__cxx11::string::~string((string *)local_108);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  peVar5 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"modelflattening/",(allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7))
  ;
  resourcePath(local_128);
  libcellml::Importer::resolveImports((shared_ptr *)peVar5,(string *)local_68);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_161 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar3) {
    testing::Message::Message(local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_198,local_160,"model->hasUnresolvedImports()","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x1c7,pcVar4);
    testing::internal::AssertHelper::operator=(local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(local_178);
    std::__cxx11::string::~string((string *)local_198);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_.message_);
  libcellml::Importer::flattenModel
            ((shared_ptr *)
             &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  p_Var1 = &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<libcellml::Model>::operator=
            ((shared_ptr<libcellml::Model> *)local_68,(shared_ptr<libcellml::Model> *)p_Var1);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)p_Var1);
  libcellml::Printer::create();
  peVar6 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar.message_,SUB81(peVar6,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1e8,"e","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar3) {
    testing::Message::Message(local_1f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x1ce,pcVar4);
    testing::internal::AssertHelper::operator=(local_1f8,local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    testing::Message::~Message(local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_68);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ModelFlattening, importedComponentUsingUnitsDefinedInImportedModel)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main_model\">\n"
        "  <units name=\"fergie_time\">\n"
        "    <unit prefix=\"mega\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"my_component\">\n"
        "    <variable name=\"time\" units=\"fergie_time\" interface=\"public_and_private\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("modelflattening/unitsdefinedinimportedmodel.xml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("modelflattening/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    auto printer = libcellml::Printer::create();

    auto a = printer->printModel(model);
    EXPECT_EQ(e, a);
}